

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  double logMax;
  int i_1;
  int offset_1;
  int l_1;
  double oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  double max;
  int k;
  int local_54;
  int local_50;
  int local_4c;
  int local_40;
  int local_3c;
  int local_38;
  double local_30;
  int local_28;
  
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x14); local_28 = local_28 + 1) {
    local_30 = 0.0;
    iVar1 = local_28 * *(int *)(in_RDI + 0x2c);
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x34); local_38 = local_38 + 1) {
      local_3c = local_38 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar1;
      for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x24); local_40 = local_40 + 1) {
        if (local_30 < *(double *)(in_RSI + (long)local_3c * 8)) {
          local_30 = *(double *)(in_RSI + (long)local_3c * 8);
        }
        local_3c = local_3c + 1;
      }
    }
    if ((local_30 == 0.0) && (!NAN(local_30))) {
      local_30 = 1.0;
    }
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x34); local_4c = local_4c + 1) {
      local_50 = local_4c * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar1;
      for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x24); local_54 = local_54 + 1) {
        *(double *)(in_RSI + (long)local_50 * 8) =
             (1.0 / local_30) * *(double *)(in_RSI + (long)local_50 * 8);
        local_50 = local_50 + 1;
      }
    }
    if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
      *(double *)(in_RDX + (long)local_28 * 8) = local_30;
      if (in_RCX != 0) {
        dVar2 = log(local_30);
        *(double *)(in_RCX + (long)local_28 * 8) = dVar2 + *(double *)(in_RCX + (long)local_28 * 8);
      }
    }
    else {
      dVar2 = log(local_30);
      *(double *)(in_RDX + (long)local_28 * 8) = dVar2;
      if (in_RCX != 0) {
        *(double *)(in_RCX + (long)local_28 * 8) = dVar2 + *(double *)(in_RCX + (long)local_28 * 8);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}